

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

int ini_save(ini_t *ini,char *data,int size)

{
  ini_internal_section_t *piVar1;
  ini_internal_property_t *piVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ini_internal_section_t *str;
  char *pcVar14;
  long lVar15;
  
  if (ini == (ini_t *)0x0) {
    iVar13 = 0;
  }
  else {
    lVar11 = (long)size;
    uVar12 = 0;
    for (uVar8 = 0; lVar15 = (long)(int)uVar12, (long)uVar8 < (long)ini->section_count;
        uVar8 = uVar8 + 1) {
      piVar1 = (ini_internal_section_t *)ini->sections[uVar8].name_large;
      str = ini->sections + uVar8;
      if (piVar1 != (ini_internal_section_t *)0x0) {
        str = piVar1;
      }
      uVar3 = sx_strlen(str->name);
      if (0 < (int)uVar3) {
        if ((data != (char *)0x0) && ((int)uVar12 < size)) {
          data[lVar15] = '[';
        }
        lVar6 = lVar15 << 0x20;
        for (uVar4 = 0; lVar6 = lVar6 + 0x100000000, uVar3 != uVar4; uVar4 = uVar4 + 1) {
          if ((data != (char *)0x0) && ((long)(lVar15 + 1 + uVar4) < lVar11)) {
            data[uVar4 + lVar15 + 1] = str->name[uVar4];
          }
        }
        iVar13 = (int)uVar4;
        if ((data != (char *)0x0) && ((int)(uVar12 + iVar13 + 1) < size)) {
          data[lVar6 >> 0x20] = ']';
        }
        if ((data != (char *)0x0) && (iVar5 = uVar12 + iVar13 + 2, iVar5 < size)) {
          data[iVar5] = '\n';
        }
        uVar12 = uVar12 + iVar13 + 3;
      }
      for (lVar15 = 0; lVar15 < ini->property_count; lVar15 = lVar15 + 1) {
        piVar2 = ini->properties;
        if (uVar8 == (uint)piVar2[lVar15].section) {
          pcVar14 = piVar2[lVar15].name;
          if (piVar2[lVar15].name_large != (char *)0x0) {
            pcVar14 = piVar2[lVar15].name_large;
          }
          uVar3 = sx_strlen(pcVar14);
          lVar6 = (long)(int)uVar12;
          uVar4 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar4 = 0;
          }
          lVar7 = lVar6 << 0x20;
          for (lVar9 = 0; -lVar9 != uVar4; lVar9 = lVar9 + -1) {
            if ((data != (char *)0x0) && (lVar6 < lVar11)) {
              data[lVar6] = *pcVar14;
            }
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 0x100000000;
            pcVar14 = pcVar14 + 1;
          }
          if ((data != (char *)0x0) && ((int)(uVar12 - (int)lVar9) < size)) {
            data[lVar7 >> 0x20] = '=';
          }
          pcVar14 = ini->properties[lVar15].value_large;
          if (pcVar14 == (char *)0x0) {
            pcVar14 = ini->properties[lVar15].value;
          }
          uVar12 = sx_strlen(pcVar14);
          uVar4 = (ulong)uVar12;
          if ((int)uVar12 < 1) {
            uVar4 = 0;
          }
          for (uVar10 = 0; lVar7 = lVar6 + 1, uVar10 != uVar4; uVar10 = uVar10 + 1) {
            if ((data != (char *)0x0) && (lVar7 < lVar11)) {
              data[lVar7] = pcVar14[uVar10];
            }
            lVar6 = lVar7;
          }
          if ((data != (char *)0x0) && ((int)lVar7 < size)) {
            data[(int)lVar7] = '\n';
          }
          uVar12 = (int)lVar6 + 2;
        }
      }
      if (0 < (int)uVar12) {
        if ((data != (char *)0x0) && ((int)uVar12 < size)) {
          data[uVar12] = '\n';
        }
        uVar12 = uVar12 + 1;
      }
    }
    if ((data != (char *)0x0) && ((int)uVar12 < size)) {
      data[lVar15] = '\0';
    }
    iVar13 = uVar12 + 1;
  }
  return iVar13;
}

Assistant:

int ini_save( ini_t const* ini, char* data, int size )
    {
    int s;
    int p;
    int i;
    int l;
    char* n;
    int pos;

    if( ini )
        {
        pos = 0;
        for( s = 0; s < ini->section_count; ++s )
            {
            n = ini->sections[ s ].name_large ? ini->sections[ s ].name_large : ini->sections[ s ].name;
            l = (int) INI_STRLEN( n );
            if( l > 0 )
                {
                if( data && pos < size ) data[ pos ] = '[';
                ++pos;
                for( i = 0; i < l; ++i )
                    {
                    if( data && pos < size ) data[ pos ] = n[ i ];
                    ++pos;
                    }
                if( data && pos < size ) data[ pos ] = ']';
                ++pos;
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }

            for( p = 0; p < ini->property_count; ++p )
                {
                if( ini->properties[ p ].section == s )
                    {
                    n = ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '=';
                    ++pos;
                    n = ini->properties[ p ].value_large ? ini->properties[ p ].value_large : ini->properties[ p ].value;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '\n';
                    ++pos;
                    }
                }

            if( pos > 0 )
                {
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }
            }

        if( data && pos < size ) data[ pos ] = '\0';
        ++pos;

        return pos;
        }

    return 0;
    }